

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

Color __thiscall Color::subtract(Color *this,uint8_t value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  uint uVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000031,value);
  uVar1 = (uint)this->_r - iVar3;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar2 = (uint)this->_g - iVar3;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar4 = (uint)this->_b - iVar3;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  return (Color)((uVar2 & 0xff) << 8 | uVar1 | (uVar4 & 0xff) << 0x10);
}

Assistant:

Color Color::subtract(uint8_t value) const
{
    int32_t r = _r - value;
    if(r < 0)
        r = 0;

    int32_t g = _g - value;
    if(g < 0)
        g = 0;

    int32_t b = _b - value;
    if(b < 0)
        b = 0;

    return { (uint8_t)r, (uint8_t)g, (uint8_t)b };
}